

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O2

uint Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
               (SmallHeapBlockBitVector *markBits,uint bucketIndex,uint pageStartBitIndex)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  SmallHeapBlockBitVector *bv;
  BVStatic<256UL> *this;
  undefined8 *in_FS_OFFSET;
  undefined1 auStack_48 [8];
  SmallHeapBlockBitVector temp;
  
  temp.data[1].word = 0;
  temp.data[2].word = 0;
  auStack_48 = (undefined1  [8])0x0;
  temp.data[0].word = 0;
  bv = HeapInfo::GetInvalidBitVectorForBucket<SmallAllocationBlockAttributes>(bucketIndex);
  BVStatic<256UL>::Copy((BVStatic<256UL> *)auStack_48,markBits);
  BVStatic<256UL>::Minus((BVStatic<256UL> *)auStack_48,bv);
  if ((char)pageStartBitIndex != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0xa4,"(pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0)",
                       "pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  this = BVStatic<256ul>::GetRange<256ul>((BVStatic<256ul> *)auStack_48,pageStartBitIndex);
  BVar4 = BVStatic<256UL>::Count(this);
  return BVar4;
}

Assistant:

uint
SmallNormalHeapBlockT<TBlockAttributes>::CalculateMarkCountForPage(SmallHeapBlockBitVector * markBits, uint bucketIndex, uint pageStartBitIndex)
{
    SmallHeapBlockBitVector temp;
    SmallHeapBlockBitVector const* invalid = HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex);

    // Remove any invalid bits from the calculation
    temp.Copy(markBits);
    temp.Minus(invalid);

    Assert(pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0);
    uint rescanMarkCount = temp.template GetRange<HeapBlockMap32::PageMarkBitCount>(pageStartBitIndex)->Count();

    // If the first object on the page is not at the start of the page, then the object containing
    // the first few bytes of the page is not included in this mark count
    // The caller will have to account for this
    return rescanMarkCount;
}